

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QString,QFileInfo>>::
emplace<std::pair<QString,QFileInfo>const&>
          (QMovableArrayOps<std::pair<QString,_QFileInfo>_> *this,qsizetype i,
          pair<QString,_QFileInfo> *args)

{
  long lVar1;
  undefined1 uVar2;
  uint uVar3;
  qsizetype qVar4;
  undefined8 in_RDX;
  QArrayDataPointer<std::pair<QString,_QFileInfo>_> *in_RSI;
  QArrayDataPointer<std::pair<QString,_QFileInfo>_> *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  pair<QString,_QFileInfo> tmp;
  pair<QString,_QFileInfo> *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 uVar6;
  undefined2 in_stack_ffffffffffffff94;
  byte bVar7;
  GrowthPosition where;
  
  where = (GrowthPosition)((ulong)in_RDX >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = QArrayDataPointer<std::pair<QString,_QFileInfo>_>::needsDetach
                    ((QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)
                     CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  if (!(bool)uVar2) {
    if ((in_RSI == (QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)in_RDI->size) &&
       (qVar4 = QArrayDataPointer<std::pair<QString,_QFileInfo>_>::freeSpaceAtEnd(in_RDI),
       qVar4 != 0)) {
      QArrayDataPointer<std::pair<QString,_QFileInfo>_>::end
                ((QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
      std::pair<QString,_QFileInfo>::pair
                ((pair<QString,_QFileInfo> *)
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00a9d4d4;
    }
    if ((in_RSI == (QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)0x0) &&
       (qVar4 = QArrayDataPointer<std::pair<QString,_QFileInfo>_>::freeSpaceAtBegin(in_RDI),
       qVar4 != 0)) {
      QArrayDataPointer<std::pair<QString,_QFileInfo>_>::begin
                ((QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)0xa9d38a);
      std::pair<QString,_QFileInfo>::pair
                ((pair<QString,_QFileInfo> *)
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00a9d4d4;
    }
  }
  std::pair<QString,_QFileInfo>::pair
            ((pair<QString,_QFileInfo> *)
             CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78
            );
  bVar5 = in_RDI->size != 0;
  uVar6 = bVar5 && in_RSI == (QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)0x0;
  uVar3 = (uint)(bVar5 && in_RSI == (QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)0x0);
  bVar7 = uVar6;
  QArrayDataPointer<std::pair<QString,_QFileInfo>_>::detachAndGrow
            (in_RSI,where,CONCAT17(uVar2,CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffff94,uVar3))),
             (pair<QString,_QFileInfo> **)in_RDI,
             (QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)
             CONCAT17(uVar6,in_stack_ffffffffffffff80));
  if ((bVar7 & 1) == 0) {
    QMovableArrayOps<std::pair<QString,_QFileInfo>_>::Inserter::Inserter
              ((Inserter *)CONCAT17(uVar2,CONCAT16(bVar7,CONCAT24(in_stack_ffffffffffffff94,uVar3)))
               ,in_RDI,CONCAT17(uVar6,in_stack_ffffffffffffff80),
               (qsizetype)in_stack_ffffffffffffff78);
    QMovableArrayOps<std::pair<QString,_QFileInfo>_>::Inserter::insertOne
              ((Inserter *)CONCAT17(uVar6,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78);
    QMovableArrayOps<std::pair<QString,_QFileInfo>_>::Inserter::~Inserter
              ((Inserter *)CONCAT17(uVar6,in_stack_ffffffffffffff80));
  }
  else {
    QArrayDataPointer<std::pair<QString,_QFileInfo>_>::begin
              ((QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)0xa9d468);
    std::pair<QString,_QFileInfo>::pair
              ((pair<QString,_QFileInfo> *)CONCAT17(uVar6,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  std::pair<QString,_QFileInfo>::~pair
            ((pair<QString,_QFileInfo> *)CONCAT17(uVar6,in_stack_ffffffffffffff80));
LAB_00a9d4d4:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }